

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void empty_closedir_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &closedir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x32,"req == &closedir_req");
    abort();
  }
  if (closedir_req.fs_type != UV_FS_CLOSEDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x33,"req->fs_type == UV_FS_CLOSEDIR");
    abort();
  }
  if (closedir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x34,"req->result == 0");
    abort();
  }
  empty_closedir_cb_count = empty_closedir_cb_count + 1;
  uv_fs_req_cleanup(&closedir_req);
  return;
}

Assistant:

static void empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->fs_type == UV_FS_CLOSEDIR);
  ASSERT(req->result == 0);
  ++empty_closedir_cb_count;
  uv_fs_req_cleanup(req);
}